

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrQueryLocalizationMapsML
                   (XrSession session,XrLocalizationMapQueryInfoBaseHeaderML *queryInfo,
                   uint32_t mapCapacityInput,uint32_t *mapCountOutput,XrLocalizationMapML *maps)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_541;
  string local_540 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_520;
  allocator local_501;
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [32];
  uint local_490;
  allocator local_489;
  uint32_t value_maps_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_468;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3d8;
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_348;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  GenValidUsageXrInstanceInfo *local_2b8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_290 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  XrSession_T local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_5c;
  undefined1 local_58 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrLocalizationMapML *maps_local;
  uint32_t *mapCountOutput_local;
  uint32_t mapCapacityInput_local;
  XrLocalizationMapQueryInfoBaseHeaderML *queryInfo_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  queryInfo_local = (XrLocalizationMapQueryInfoBaseHeaderML *)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  local_5c = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_58
             ,(XrSession_T **)&queryInfo_local,&local_5c);
  VVar2 = VerifyXrSessionHandle((XrSession *)&queryInfo_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)queryInfo_local);
    pVar3.second = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    pVar1 = pVar3;
    if (queryInfo != (XrLocalizationMapQueryInfoBaseHeaderML *)0x0) {
      local_2b8 = pVar3.second;
      gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar3.second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"xrQueryLocalizationMapsML",&local_2d9);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pVar3.second,(string *)local_2d8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_58,false,true,queryInfo);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      pVar3.second = local_2b8;
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_session_info;
      pVar3.second = local_2b8;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_300,"VUID-xrQueryLocalizationMapsML-queryInfo-parameter",&local_301);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_328,"xrQueryLocalizationMapsML",&local_329);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_348,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_368,"Command xrQueryLocalizationMapsML param queryInfo is invalid",
                   &local_369);
        CoreValidLogMessage(pVar3.second,(string *)local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_328,&local_348,(string *)local_368);
        std::__cxx11::string::~string(local_368);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_348);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        std::__cxx11::string::~string(local_300);
        std::allocator<char>::~allocator((allocator<char> *)&local_301);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_session_info;
        pVar3.second = local_2b8;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
        goto LAB_002e09e3;
      }
    }
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
    gen_session_info = pVar1.first;
    local_2b8 = pVar3.second;
    pVar3.second = local_2b8;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    if ((mapCapacityInput == 0) || (maps != (XrLocalizationMapML *)0x0)) {
      if (mapCountOutput == (uint32_t *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_420,"VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter",&local_421);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_448,"xrQueryLocalizationMapsML",&local_449);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_468,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_maps_inc,
                   "Invalid NULL for uint32_t \"mapCountOutput\" which is not optional and must be non-NULL"
                   ,&local_489);
        CoreValidLogMessage(pVar3.second,(string *)local_420,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_448,&local_468,(string *)&value_maps_inc);
        std::__cxx11::string::~string((string *)&value_maps_inc);
        std::allocator<char>::~allocator((allocator<char> *)&local_489);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_468);
        std::__cxx11::string::~string(local_448);
        std::allocator<char>::~allocator((allocator<char> *)&local_449);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_session_info;
        pVar3.second = local_2b8;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        if (maps != (XrLocalizationMapML *)0x0) {
          local_490 = 0;
          while( true ) {
            info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
            gen_session_info = pVar1.first;
            local_2b8 = pVar3.second;
            pVar3.second = local_2b8;
            gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
            if (mapCapacityInput <= local_490) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4b0,"xrQueryLocalizationMapsML",&local_4b1);
            objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 ValidateXrStruct(pVar3.second,(string *)local_4b0,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)local_58,true,true,maps + local_490);
            std::__cxx11::string::~string(local_4b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
            pVar3.second = local_2b8;
            pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
            pVar1.first = gen_session_info;
            pVar3.second = local_2b8;
            pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
            if (objects_info.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4d8,"VUID-xrQueryLocalizationMapsML-maps-parameter",&local_4d9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_500,"xrQueryLocalizationMapsML",&local_501);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_520,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_58);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_540,"Command xrQueryLocalizationMapsML param maps is invalid",
                         &local_541);
              CoreValidLogMessage(pVar3.second,(string *)local_4d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  (string *)local_500,&local_520,(string *)local_540);
              std::__cxx11::string::~string(local_540);
              std::allocator<char>::~allocator((allocator<char> *)&local_541);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_520);
              std::__cxx11::string::~string(local_500);
              std::allocator<char>::~allocator((allocator<char> *)&local_501);
              std::__cxx11::string::~string(local_4d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
              pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
              pVar1.first = gen_session_info;
              pVar3.second = local_2b8;
              pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
              session_local._4_4_ =
                   objects_info.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              info_with_instance.second._4_4_ = 1;
              goto LAB_002e09e3;
            }
            local_490 = local_490 + 1;
          }
        }
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_390,"VUID-xrQueryLocalizationMapsML-maps-parameter",&local_391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"xrQueryLocalizationMapsML",&local_3b9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3d8,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3f8,
                 "Command xrQueryLocalizationMapsML param maps is NULL, but mapCapacityInput is greater than 0"
                 ,&local_3f9);
      CoreValidLogMessage(pVar3.second,(string *)local_390,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_3b8,&local_3d8,(string *)local_3f8);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3d8);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_session_info;
      pVar3.second = local_2b8;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::operator<<((ostream *)local_1e8,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_208);
    std::operator<<((ostream *)local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"VUID-xrQueryLocalizationMapsML-session-parameter",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"xrQueryLocalizationMapsML",&local_251);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_270,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_58);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_228,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_250,&local_270,local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_270);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_session_info;
    pVar3.second = local_2b8;
    pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
LAB_002e09e3:
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_session_info = pVar1.first;
  local_2b8 = pVar3.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrQueryLocalizationMapsML(
XrSession session,
const XrLocalizationMapQueryInfoBaseHeaderML* queryInfo,
uint32_t mapCapacityInput,
uint32_t * mapCountOutput,
XrLocalizationMapML* maps) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrQueryLocalizationMapsML-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the base-structure XrLocalizationMapQueryInfoBaseHeaderML is valid
        if (nullptr != queryInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrQueryLocalizationMapsML",
                                                            objects_info, false, true, queryInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-queryInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                    objects_info,
                                    "Command xrQueryLocalizationMapsML param queryInfo is invalid");
                return xr_result;
            }
        }
        // Optional array must be non-NULL when mapCapacityInput is non-zero
        if (0 != mapCapacityInput && nullptr == maps) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-maps-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                objects_info,
                                "Command xrQueryLocalizationMapsML param maps is NULL, but mapCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == mapCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML", objects_info,
                                "Invalid NULL for uint32_t \"mapCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter" type
        if (maps) {
            for (uint32_t value_maps_inc = 0; value_maps_inc < mapCapacityInput; ++value_maps_inc) {
                // Validate that the structure XrLocalizationMapML is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrQueryLocalizationMapsML", objects_info,
                                                                true, true, &maps[value_maps_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-maps-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                        objects_info,
                                        "Command xrQueryLocalizationMapsML param maps is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}